

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_queue_remove_active(event_base *base,event_callback *evcb)

{
  event_callback **ppeVar1;
  int iVar2;
  event_callback *peVar3;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar2 = evthread_is_debug_lock_held_(base->th_base_lock), iVar2 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xca9,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_queue_remove_active");
  }
  if ((evcb->evcb_flags & 8U) == 0) {
    event_errx(1,"%s: %p not on queue %x","event_queue_remove_active",evcb,8);
  }
  base->event_count = base->event_count - (uint)((evcb->evcb_flags & 0x10U) == 0);
  *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags & 0xf7;
  base->event_count_active = base->event_count_active + -1;
  peVar3 = (evcb->evcb_active_next).tqe_next;
  ppeVar1 = (evcb->evcb_active_next).tqe_prev;
  if (peVar3 == (event_callback *)0x0) {
    peVar3 = (event_callback *)(base->activequeues + evcb->evcb_pri);
  }
  (peVar3->evcb_active_next).tqe_prev = ppeVar1;
  *ppeVar1 = (evcb->evcb_active_next).tqe_next;
  return;
}

Assistant:

static void
event_queue_remove_active(struct event_base *base, struct event_callback *evcb)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(evcb->evcb_flags & EVLIST_ACTIVE))) {
		event_errx(1, "%s: %p not on queue %x", __func__,
			   evcb, EVLIST_ACTIVE);
		return;
	}
	DECR_EVENT_COUNT(base, evcb->evcb_flags);
	evcb->evcb_flags &= ~EVLIST_ACTIVE;
	base->event_count_active--;

	TAILQ_REMOVE(&base->activequeues[evcb->evcb_pri],
	    evcb, evcb_active_next);
}